

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O1

void Choice_Handle_New_Old
               (Am_Object *command_obj,Am_Object *new_object,Am_Object *inter,int x,int y,
               Am_Object *ref_obj,Am_Input_Char ic)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object prev_object;
  Am_Object start_object;
  
  pAVar2 = Am_Object::Get(inter,0xd5,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    start_object.data = (Am_Object_Data *)0x0;
    pAVar2 = Am_Object::Get(inter,0x11a,0);
    Am_Object::operator=(&start_object,pAVar2);
    bVar1 = Am_Object::operator!=(new_object,&start_object);
    if (bVar1) {
      Am_Object::operator=(new_object,&Am_No_Object);
    }
    Am_Object::~Am_Object(&start_object);
  }
  prev_object.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::operator=(&prev_object,pAVar2);
  bVar1 = Am_Object::operator!=(&prev_object,new_object);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&prev_object);
    Am_Object::Set(inter,0x16b,pAVar3,0);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(new_object);
    Am_Object::Set(inter,0x16a,pAVar3,0);
    Am_Inter_Call_Both_Method(inter,command_obj,200,x,y,ref_obj,&ic,new_object,&Am_No_Location);
  }
  Am_Object::~Am_Object(&prev_object);
  return;
}

Assistant:

void
Choice_Handle_New_Old(Am_Object command_obj, Am_Object new_object,
                      Am_Object inter, int x, int y, Am_Object ref_obj,
                      Am_Input_Char ic)
{
  if ((bool)inter.Get(Am_FIRST_ONE_ONLY)) {
    Am_Object start_object;
    start_object = inter.Get(Am_START_OBJECT);
    if (new_object != start_object)
      new_object = Am_No_Object;
  }
  Am_Object prev_object;
  prev_object = inter.Get(Am_INTERIM_VALUE);
  if (prev_object != new_object) {
    inter.Set(Am_OLD_INTERIM_VALUE, prev_object);
    inter.Set(Am_INTERIM_VALUE, new_object);
    Am_Inter_Call_Both_Method(inter, command_obj, Am_INTERIM_DO_METHOD, x, y,
                              ref_obj, ic, new_object, Am_No_Location);
  }
}